

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearDecayCorrelationModel.cpp
# Opt level: O3

void __thiscall
csm::LinearDecayCorrelationModel::setCorrelationGroupParameters
          (LinearDecayCorrelationModel *this,size_t cpGroupIndex,Parameters *params)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pPVar5;
  Error *pEVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ErrorType local_6c;
  string local_68;
  string local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"setCorrelationGroupParameters","");
  checkParameterGroupIndex(this,cpGroupIndex,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pdVar3 = (params->theInitialCorrsPerSegment).super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar7 = (long)(params->theInitialCorrsPerSegment).
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_finish - (long)pdVar3;
  pdVar4 = (params->theTimesPerSegment).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (lVar7 != (long)(params->theTimesPerSegment).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar4) {
    pEVar6 = (Error *)__cxa_allocate_exception(0x50);
    local_6c = BOUNDS;
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"Must have equal number of correlations and times.","");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"csm::LinearDecayCorrelationModel::setCorrelationGroupParameters"
               ,"");
    Error::Error(pEVar6,&local_6c,&local_68,&local_48);
    __cxa_throw(pEVar6,&Error::typeinfo,Error::~Error);
  }
  uVar8 = lVar7 >> 3;
  if (1 < uVar8) {
    uVar9 = 0;
    do {
      dVar2 = pdVar3[uVar9];
      if ((dVar2 < 0.0) || (1.0 < dVar2)) {
        pEVar6 = (Error *)__cxa_allocate_exception(0x50);
        local_6c = BOUNDS;
        local_68._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"Correlation must be in range [0..1].","");
        local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_48,
                   "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters","");
        Error::Error(pEVar6,&local_6c,&local_68,&local_48);
        __cxa_throw(pEVar6,&Error::typeinfo,Error::~Error);
      }
      if (uVar9 != 0) {
        if (pdVar3[uVar9 - 1] <= dVar2 && dVar2 != pdVar3[uVar9 - 1]) {
          pEVar6 = (Error *)__cxa_allocate_exception(0x50);
          local_6c = BOUNDS;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Correlation must be monotomically decreasing.","");
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,
                     "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters","");
          Error::Error(pEVar6,&local_6c,&local_68,&local_48);
          __cxa_throw(pEVar6,&Error::typeinfo,Error::~Error);
        }
        if (pdVar4[uVar9] <= pdVar4[uVar9 - 1] && pdVar4[uVar9 - 1] != pdVar4[uVar9]) {
          pEVar6 = (Error *)__cxa_allocate_exception(0x50);
          local_6c = BOUNDS;
          local_68._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,"Time must be monotomically increasing.","");
          local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_48,
                     "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters","");
          Error::Error(pEVar6,&local_6c,&local_68,&local_48);
          __cxa_throw(pEVar6,&Error::typeinfo,Error::~Error);
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  pPVar5 = (this->theCorrParams).
           super__Vector_base<csm::LinearDecayCorrelationModel::Parameters,_std::allocator<csm::LinearDecayCorrelationModel::Parameters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  std::vector<double,_std::allocator<double>_>::operator=
            (&pPVar5[cpGroupIndex].theInitialCorrsPerSegment,&params->theInitialCorrsPerSegment);
  std::vector<double,_std::allocator<double>_>::operator=
            (&pPVar5[cpGroupIndex].theTimesPerSegment,&params->theTimesPerSegment);
  return;
}

Assistant:

void LinearDecayCorrelationModel::setCorrelationGroupParameters(
   size_t            cpGroupIndex,
   const Parameters& params)
{
   static const char* const MODULE =
      "csm::LinearDecayCorrelationModel::setCorrelationGroupParameters";

   // make sure the index falls within the acceptable range
   checkParameterGroupIndex(cpGroupIndex, "setCorrelationGroupParameters");

   // make sure the values of each correlation model parameter
   // fall within acceptable ranges
   size_t size = params.theInitialCorrsPerSegment.size();
   if (size != params.theTimesPerSegment.size())
   {
      throw Error(
         Error::BOUNDS,
         "Must have equal number of correlations and times.",
         MODULE);
   }

   double corr, prevCorr;
   double time, prevTime;

   if (size > 1)
   {
      for(size_t i = 0; i < size; ++i)
      {
         corr = params.theInitialCorrsPerSegment[i];
         time = params.theTimesPerSegment[i];
         if (corr < 0.0 || corr > 1.0)
         {
            throw Error(
               Error::BOUNDS,
               "Correlation must be in range [0..1].",
               MODULE);
         }

         if (i > 0)
         {
            prevCorr = params.theInitialCorrsPerSegment[i-1];
            prevTime = params.theTimesPerSegment[i-1];
            if (corr > prevCorr)
            {
               throw Error(
                  Error::BOUNDS,
                  "Correlation must be monotomically decreasing.",
                  MODULE);
            }
            if (time < prevTime)
            {
               throw Error(
                  Error::BOUNDS,
                  "Time must be monotomically increasing.",
                  MODULE);
            }
         }
      }
   }

   // store the correlation parameter values
   theCorrParams[cpGroupIndex] = params;
}